

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::Unload(Map *this)

{
  pointer ppNVar1;
  long lVar2;
  pointer ppAVar3;
  pointer pMVar4;
  _List_iterator<NPC_*> __first;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *plVar5;
  pointer ppAVar6;
  pointer ppNVar7;
  _List_node_base *p_Var8;
  Arena *this_00;
  _List_iterator<NPC_*> __last;
  NPC *npc;
  NPC *local_38;
  
  this->exists = false;
  ppNVar7 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar7 != ppNVar1) {
    do {
      local_38 = *ppNVar7;
      plVar5 = &local_38->damagelist;
      for (p_Var8 = (local_38->damagelist).
                    super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var8 != (_List_node_base *)plVar5; p_Var8 = p_Var8->_M_next) {
        lVar2 = (long)(p_Var8[1]._M_next)->_M_next;
        __last._M_node = (_List_node_base *)(lVar2 + 0x378);
        __first = std::
                  __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                            (*(_List_node_base **)(lVar2 + 0x378),__last,
                             (_Iter_equals_val<NPC_*const>)&local_38);
        std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                  ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,
                   (const_iterator)__first._M_node,(p_Var8[1]._M_next)->_M_next + 0x378);
      }
      ppNVar7 = ppNVar7 + 1;
    } while (ppNVar7 != ppNVar1);
    ppNVar7 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar7) {
      (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data
      ._M_finish = ppNVar7;
    }
  }
  this_00 = this->arena;
  if (this_00 == (Arena *)0x0) goto LAB_0016f9b3;
  ppAVar6 = (this_00->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar3 = (this_00->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar6 == ppAVar3) {
LAB_0016f999:
    Arena::~Arena(this_00);
  }
  else {
    do {
      operator_delete(*ppAVar6,4);
      ppAVar6 = ppAVar6 + 1;
    } while (ppAVar6 != ppAVar3);
    this_00 = this->arena;
    if (this_00 != (Arena *)0x0) goto LAB_0016f999;
    this_00 = (Arena *)0x0;
  }
  operator_delete(this_00,0x38);
LAB_0016f9b3:
  this->arena = (Arena *)0x0;
  std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::clear
            (&this->chests);
  pMVar4 = (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar4;
  }
  return;
}

Assistant:

void Map::Unload()
{
	this->exists = false;

	UTIL_FOREACH(this->npcs, npc)
	{
		UTIL_FOREACH_CREF(npc->damagelist, opponent)
		{
			opponent->attacker->unregister_npc.erase(
				std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), npc),
				opponent->attacker->unregister_npc.end()
			);
		}
	}

	this->npcs.clear();

	if (this->arena)
	{
		UTIL_FOREACH(this->arena->spawns, spawn)
			delete spawn;

		delete this->arena;
	}

	this->arena = nullptr;

	this->chests.clear();
	this->tiles.clear();
}